

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::Encode
          (Electromagnetic_Emission_PDU *this,KDataStream *stream)

{
  pointer pEVar1;
  pointer pEVar2;
  
  Header7::Encode(&this->super_Header,stream);
  (*(this->m_EmittingEntityID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EmittingEntityID,stream);
  (*(this->m_EventID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_EventID,stream);
  KDataStream::Write(stream,this->m_ui8StateUpdateIndicator);
  KDataStream::Write(stream,this->m_ui8NumberOfEmissionSystems);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16Padding);
  pEVar1 = (this->m_vEmissionSystem).
           super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pEVar2 = (this->m_vEmissionSystem).
                super__Vector_base<KDIS::DATA_TYPE::EmissionSystem,_std::allocator<KDIS::DATA_TYPE::EmissionSystem>_>
                ._M_impl.super__Vector_impl_data._M_start; pEVar2 != pEVar1; pEVar2 = pEVar2 + 1) {
    (*(pEVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pEVar2,stream);
  }
  return;
}

Assistant:

void Electromagnetic_Emission_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_EmittingEntityID
           << KDIS_STREAM m_EventID
           << m_ui8StateUpdateIndicator
           << m_ui8NumberOfEmissionSystems
           << m_ui16Padding;

    vector<EmissionSystem>::const_iterator citr = m_vEmissionSystem.begin();
    vector<EmissionSystem>::const_iterator citrEnd = m_vEmissionSystem.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}